

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_receiver.c
# Opt level: O3

AMQP_VALUE
on_transfer_received
          (void *context,TRANSFER_HANDLE transfer,uint32_t payload_size,uchar *payload_bytes)

{
  undefined4 uVar1;
  int iVar2;
  MESSAGE_HANDLE message;
  AMQPVALUE_DECODER_HANDLE handle;
  LOGGER_LOG p_Var3;
  AMQP_VALUE pAVar4;
  char *pcVar5;
  
  if (*(long *)((long)context + 8) == 0) {
    return (AMQP_VALUE)0x0;
  }
  message = message_create();
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                ,"on_transfer_received",0xef,1,"Cannot create message");
    }
    uVar1 = *(undefined4 *)((long)context + 0x18);
    *(undefined4 *)((long)context + 0x18) = 5;
    if (*(code **)((long)context + 0x10) == (code *)0x0) {
      return (AMQP_VALUE)0x0;
    }
    (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),5,uVar1);
    return (AMQP_VALUE)0x0;
  }
  handle = amqpvalue_decoder_create(decode_message_value_callback,context);
  if (handle == (AMQPVALUE_DECODER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                ,"on_transfer_received",0xf7,1,"Cannot create AMQP value decoder");
    }
    uVar1 = *(undefined4 *)((long)context + 0x18);
    *(undefined4 *)((long)context + 0x18) = 5;
    if (*(code **)((long)context + 0x10) != (code *)0x0) {
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),5,uVar1);
    }
    pAVar4 = (AMQP_VALUE)0x0;
    goto LAB_0011389e;
  }
  *(MESSAGE_HANDLE *)((long)context + 0x30) = message;
  *(undefined1 *)((long)context + 0x38) = 0;
  iVar2 = amqpvalue_decode_bytes(handle,payload_bytes,(ulong)payload_size);
  if (iVar2 == 0) {
    if (*(char *)((long)context + 0x38) == '\x01') {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar5 = "Error decoding message";
        iVar2 = 0x107;
        goto LAB_00113868;
      }
      goto LAB_00113873;
    }
    pAVar4 = (AMQP_VALUE)
             (**(code **)((long)context + 8))(*(undefined8 *)((long)context + 0x28),message);
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      pcVar5 = "Cannot decode bytes";
      iVar2 = 0x100;
LAB_00113868:
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/message_receiver.c"
                ,"on_transfer_received",iVar2,1,pcVar5);
    }
LAB_00113873:
    uVar1 = *(undefined4 *)((long)context + 0x18);
    *(undefined4 *)((long)context + 0x18) = 5;
    if (*(code **)((long)context + 0x10) != (code *)0x0) {
      (**(code **)((long)context + 0x10))(*(undefined8 *)((long)context + 0x20),5,uVar1);
    }
    pAVar4 = (AMQP_VALUE)0x0;
  }
  amqpvalue_decoder_destroy(handle);
LAB_0011389e:
  message_destroy(message);
  return pAVar4;
}

Assistant:

static AMQP_VALUE on_transfer_received(void* context, TRANSFER_HANDLE transfer, uint32_t payload_size, const unsigned char* payload_bytes)
{
    AMQP_VALUE result = NULL;
    MESSAGE_RECEIVER_INSTANCE* message_receiver = (MESSAGE_RECEIVER_INSTANCE*)context;

    (void)transfer;
    if (message_receiver->on_message_received != NULL)
    {
        MESSAGE_HANDLE message = message_create();
        if (message == NULL)
        {
            LogError("Cannot create message");
            set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
        }
        else
        {
            AMQPVALUE_DECODER_HANDLE amqpvalue_decoder = amqpvalue_decoder_create(decode_message_value_callback, message_receiver);
            if (amqpvalue_decoder == NULL)
            {
                LogError("Cannot create AMQP value decoder");
                set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
            }
            else
            {
                message_receiver->decoded_message = message;
                message_receiver->decode_error = false;
                if (amqpvalue_decode_bytes(amqpvalue_decoder, payload_bytes, payload_size) != 0)
                {
                    LogError("Cannot decode bytes");
                    set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
                }
                else
                {
                    if (message_receiver->decode_error)
                    {
                        LogError("Error decoding message");
                        set_message_receiver_state(message_receiver, MESSAGE_RECEIVER_STATE_ERROR);
                    }
                    else
                    {
                        result = message_receiver->on_message_received(message_receiver->callback_context, message);
                    }
                }

                amqpvalue_decoder_destroy(amqpvalue_decoder);
            }

            message_destroy(message);
        }
    }

    return result;
}